

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerNSC.cpp
# Opt level: O2

void chrono::
     _OptimalContactInsert<chrono::ChContactNSC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<3>>,std::_List_iterator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<3>>*>,chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<3>>
               (list<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>_>
                *contactlist,
               _List_iterator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>
               *lastcontact,int *n_added,ChContactContainer *container,
               ChContactable_3vars<3,_3,_3> *objA,ChContactable_1vars<3> *objB,
               ChCollisionInfo *cinfo,ChMaterialCompositeNSC *cmat)

{
  _List_node_base *p_Var1;
  ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_> *this;
  ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_> *local_38;
  
  if (lastcontact->_M_node == (_List_node_base *)contactlist) {
    this = (ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_> *)
           ::operator_new(0x498);
    ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>::
    ChContactNSC(this,container,objA,objB,cinfo,cmat);
    local_38 = this;
    std::__cxx11::
    list<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>_>
    ::push_back(contactlist,&local_38);
    lastcontact->_M_node = (_List_node_base *)contactlist;
  }
  else {
    p_Var1 = lastcontact->_M_node[1]._M_next;
    (*(code *)p_Var1->_M_next[8]._M_next)(p_Var1,objA,objB,cinfo,cmat);
    lastcontact->_M_node = lastcontact->_M_node->_M_next;
  }
  *n_added = *n_added + 1;
  return;
}

Assistant:

void _OptimalContactInsert(std::list<Tcont*>& contactlist,           // contact list
                           Titer& lastcontact,                       // last contact acquired
                           int& n_added,                             // number of contacts inserted
                           ChContactContainer* container,            // contact container
                           Ta* objA,                                 // collidable object A
                           Tb* objB,                                 // collidable object B
                           const collision::ChCollisionInfo& cinfo,  // collision information
                           const ChMaterialCompositeNSC& cmat        // composite material
) {
    if (lastcontact != contactlist.end()) {
        // reuse old contacts
        (*lastcontact)->Reset(objA, objB, cinfo, cmat);
        lastcontact++;
    } else {
        // add new contact
        Tcont* mc = new Tcont(container, objA, objB, cinfo, cmat);
        contactlist.push_back(mc);
        lastcontact = contactlist.end();
    }
    n_added++;
}